

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRef.c
# Opt level: O0

void Rnm_ManCleanValues(Rnm_Man_t *p)

{
  Gia_Man_t *pGVar1;
  int iVar2;
  bool bVar3;
  int local_1c;
  Gia_Obj_t *pGStack_18;
  int i;
  Gia_Obj_t *pObj;
  Rnm_Man_t *p_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vMap);
    bVar3 = false;
    if (local_1c < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p->vMap,local_1c);
      pGStack_18 = Gia_ManObj(pGVar1,iVar2);
      bVar3 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGStack_18->Value = 0;
    local_1c = local_1c + 1;
  }
  local_1c = 0;
  while( true ) {
    iVar2 = Vec_IntSize(p->vObjs);
    bVar3 = false;
    if (local_1c < iVar2) {
      pGVar1 = p->pGia;
      iVar2 = Vec_IntEntry(p->vObjs,local_1c);
      pGStack_18 = Gia_ManObj(pGVar1,iVar2);
      bVar3 = pGStack_18 != (Gia_Obj_t *)0x0;
    }
    if (!bVar3) break;
    pGStack_18->Value = 0;
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void Rnm_ManCleanValues( Rnm_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
        pObj->Value = 0;
    Gia_ManForEachObjVec( p->vObjs, p->pGia, pObj, i )
        pObj->Value = 0;
}